

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  _Self __tmp;
  undefined8 uVar6;
  ulong uVar7;
  size_t sStack_490;
  allocator local_488 [8];
  char r_buf [1024];
  string b;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  string serial_port;
  
  getComList_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)
             &l.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size,"",local_488);
  std::__cxx11::string::string((string *)(r_buf + 0x3f8),"USB",local_488);
  iVar4 = 0;
  for (uVar6 = b.field_2._8_8_; (undefined8 *)uVar6 != (undefined8 *)((long)&b.field_2 + 8);
      uVar6 = *(undefined8 *)uVar6) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)(uVar6 + 0x10));
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = std::__cxx11::string::find((string *)(uVar6 + 0x10),(ulong)(r_buf + 0x3f8));
    if (lVar3 != -1) {
      std::operator<<((ostream *)&std::cout,"found\n");
      std::__cxx11::string::_M_assign
                ((string *)
                 &l.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size);
      iVar4 = iVar4 + 1;
    }
  }
  if (iVar4 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"find serial port, OK!!!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"serial_port == ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &l.
                                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl._M_node._M_size);
  }
  else {
    pcVar5 = "not found right serial port,please check!!!";
    if (1 < iVar4) {
      pcVar5 = "find more than one serial port,please choose check!!!";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar5);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  bzero(local_488,0x400);
  IMU_JY61::fd = IMU_JY61::uart_open(IMU_JY61::fd,
                                     (char *)l.
                                             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl._M_node._M_size);
  if (IMU_JY61::fd == -1) {
    pcVar5 = "uart_open error\n";
    sStack_490 = 0x10;
  }
  else {
    iVar4 = IMU_JY61::uart_set(IMU_JY61::fd,0x1c200,8,'N',1);
    if (iVar4 == -1) {
      pcVar5 = "uart set failed!\n";
      sStack_490 = 0x11;
    }
    else {
      IMU_JY61::getTime();
      while( true ) {
        uVar1 = IMU_JY61::recv_data(IMU_JY61::fd,(char *)local_488,0x2c);
        if (uVar1 == 0xffffffff) break;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
          IMU_JY61::ParseData((char)local_488[uVar7]);
        }
        usleep(1000);
      }
      pcVar5 = "uart read failed!\n";
      sStack_490 = 0x12;
    }
  }
  fwrite(pcVar5,sStack_490,1,_stderr);
  exit(1);
}

Assistant:

int main(void)
{
    //qxiaofan added
    //自动识别串口
    list<string> l = getComList();

    list<string>::iterator it = l.begin();

    std::string serial_port= "";
    std::string b = "USB";
    string::size_type idx;

    int success_num = 0;

    while (it != l.end()) {
        cout << *it << endl;

        idx = it->find(b);
        if(idx != string::npos)
        {
            cout<<"found\n";
            success_num++;
            serial_port = *it;
        }
        it++;
    }

    if(success_num == 1)
    {
        std::cout<<"find serial port, OK!!!"<<std::endl;
        std::cout<<"serial_port == "<<serial_port<<std::endl;
    }

    if(success_num > 1)
    {
        std::cout<<"find more than one serial port,please choose check!!!"<<std::endl;
    }

    if(success_num < 1)
    {
        std::cout<<"not found right serial port,please check!!!"<<std::endl;
    }
    //qxiaofan ended

    char r_buf[1024];
    bzero(r_buf,1024);

    //src
    //fd = uart_open(fd,"/dev/ttyUSB1");/*串口号/dev/ttySn,USB口号/dev/ttyUSBn */

    fd = uart_open(fd,serial_port.c_str());

    if(fd == -1)
    {
        fprintf(stderr,"uart_open error\n");
        exit(EXIT_FAILURE);
    }

    if(uart_set(fd,BAUD,8,'N',1) == -1)
    {
        fprintf(stderr,"uart set failed!\n");
        exit(EXIT_FAILURE);
    }

    //src
	//FILE *fp;
	//fp = fopen("Record.txt","w");

	long time_base = getTime();
    while(1)
    {
        ret = recv_data(fd,r_buf,44);
        if(ret == -1)
        {
            fprintf(stderr,"uart read failed!\n");
            exit(EXIT_FAILURE);
        }
		for (int i=0;i<ret;i++) {
		    //fprintf(fp,"%2X ",r_buf[i]);
		    //std::cout<<"r_buf["<<i<<"] == "<<r_buf[i]<<std::endl;
		    ParseData(r_buf[i]);
		}
        usleep(1000);
    }

    ret = uart_close(fd);
    if(ret == -1)
    {
        fprintf(stderr,"uart_close error\n");
        exit(EXIT_FAILURE);
    }

    exit(EXIT_SUCCESS);
}